

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nihgui.cpp
# Opt level: O2

void __thiscall Button::on_mouse_button_up(Button *this,int mx,int my)

{
  int iVar1;
  
  iVar1 = (*(this->super_Widget)._vptr_Widget[0x10])();
  if ((char)iVar1 == '\0') {
    this->pushed = false;
    ((this->super_Widget).dialog)->draw_requested = true;
  }
  return;
}

Assistant:

void Button::on_mouse_button_up(int mx, int my)
{
   (void)mx;
   (void)my;

   if (is_disabled())
      return;

   this->pushed = false;
   dialog->request_draw();
}